

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Select_Charmap(FT_Face face,FT_Encoding encoding)

{
  FT_CharMap *ppFVar1;
  FT_CharMap *limit;
  FT_CharMap *cur;
  FT_Encoding encoding_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (encoding == FT_ENCODING_NONE) {
    face_local._4_4_ = 6;
  }
  else if (encoding == FT_ENCODING_UNICODE) {
    face_local._4_4_ = find_unicode_charmap(face);
  }
  else {
    limit = face->charmaps;
    if (limit == (FT_CharMap *)0x0) {
      face_local._4_4_ = 0x26;
    }
    else {
      ppFVar1 = limit + face->num_charmaps;
      for (; limit < ppFVar1; limit = limit + 1) {
        if ((*limit)->encoding == encoding) {
          face->charmap = *limit;
          return 0;
        }
      }
      face_local._4_4_ = 6;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Select_Charmap( FT_Face      face,
                     FT_Encoding  encoding )
  {
    FT_CharMap*  cur;
    FT_CharMap*  limit;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( encoding == FT_ENCODING_NONE )
      return FT_THROW( Invalid_Argument );

    /* FT_ENCODING_UNICODE is special.  We try to find the `best' Unicode */
    /* charmap available, i.e., one with UCS-4 characters, if possible.   */
    /*                                                                    */
    /* This is done by find_unicode_charmap() above, to share code.       */
    if ( encoding == FT_ENCODING_UNICODE )
      return find_unicode_charmap( face );

    cur = face->charmaps;
    if ( !cur )
      return FT_THROW( Invalid_CharMap_Handle );

    limit = cur + face->num_charmaps;

    for ( ; cur < limit; cur++ )
    {
      if ( cur[0]->encoding == encoding )
      {
        face->charmap = cur[0];
        return 0;
      }
    }

    return FT_THROW( Invalid_Argument );
  }